

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecPat.c
# Opt level: O3

void Cec_ManPatComputePattern2_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vPat)

{
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pGVar1;
  ulong uVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  
  pGVar4 = p->pObjs;
  if (pGVar4 <= pObj) {
    do {
      if (pGVar4 + p->nObjs <= pObj) break;
      iVar3 = (int)((long)pObj - (long)pGVar4 >> 2) * -0x55555555;
      if (p->nTravIdsAlloc <= iVar3) {
        __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x263,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
      }
      if (p->pTravIds[iVar3] == p->nTravIds) {
        return;
      }
      p->pTravIds[iVar3] = p->nTravIds;
      uVar2 = *(ulong *)pObj;
      uVar5 = (uint)uVar2;
      if ((~uVar5 & 0x9fffffff) == 0) {
        Vec_IntPush(vPat,(uint)(uVar2 >> 0x1f) & 0x3ffffffe |
                         (uint)((uVar2 & 0x4000000000000000) == 0));
        return;
      }
      if (((int)uVar5 < 0) || ((uVar5 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecPat.c"
                      ,0xda,
                      "void Cec_ManPatComputePattern2_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
      }
      pObj_00 = pObj + -(ulong)(uVar5 & 0x1fffffff);
      if ((uVar2 & 0x4000000000000000) == 0) {
        uVar5 = (uint)(uVar2 >> 0x20);
        if (((((uint)(uVar2 >> 0x1d) & 7 ^ (uint)((ulong)*(undefined8 *)pObj_00 >> 0x3e)) & 1) != 0)
           && (((uVar5 >> 0x1d ^
                (uint)((ulong)*(undefined8 *)(pObj + -(ulong)(uVar5 & 0x1fffffff)) >> 0x3e)) & 1) !=
               0)) {
          __assert_fail("(Gia_ObjFanin0(pObj)->fMark1 ^ Gia_ObjFaninC0(pObj)) == 0 || (Gia_ObjFanin1(pObj)->fMark1 ^ Gia_ObjFaninC1(pObj)) == 0"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecPat.c"
                        ,0xe3,
                        "void Cec_ManPatComputePattern2_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)")
          ;
        }
        pGVar1 = pObj + -(ulong)(uVar5 & 0x1fffffff);
        pObj = pObj_00;
        if (((uVar5 >> 0x1d ^ (uint)((ulong)*(undefined8 *)pGVar1 >> 0x3e)) & 1) == 0) {
          pObj = pGVar1;
        }
      }
      else {
        Cec_ManPatComputePattern2_rec(p,pObj_00,vPat);
        pGVar4 = p->pObjs;
        pObj = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
      }
    } while (pGVar4 <= pObj);
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Cec_ManPatComputePattern2_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vPat )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCi(pObj) )
    {
        Vec_IntPush( vPat, Abc_Var2Lit( Gia_ObjCioId(pObj), pObj->fMark1==0 ) );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    if ( pObj->fMark1 == 1 )
    {
        Cec_ManPatComputePattern2_rec( p, Gia_ObjFanin0(pObj), vPat );
        Cec_ManPatComputePattern2_rec( p, Gia_ObjFanin1(pObj), vPat );
    }
    else
    {
        assert( (Gia_ObjFanin0(pObj)->fMark1 ^ Gia_ObjFaninC0(pObj)) == 0 ||
                (Gia_ObjFanin1(pObj)->fMark1 ^ Gia_ObjFaninC1(pObj)) == 0 );
        if ( (Gia_ObjFanin1(pObj)->fMark1 ^ Gia_ObjFaninC1(pObj)) == 0 )
            Cec_ManPatComputePattern2_rec( p, Gia_ObjFanin1(pObj), vPat );
        else
            Cec_ManPatComputePattern2_rec( p, Gia_ObjFanin0(pObj), vPat );
    }
}